

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.hpp
# Opt level: O1

double __thiscall gl4cts::ShaderSubroutine::Utils::vec4<float>::log(vec4<float> *this,double __x)

{
  ostream *poVar1;
  long in_RSI;
  double extraout_XMM0_Qa;
  
  poVar1 = (ostream *)(in_RSI + 8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[ ",2);
  std::ostream::_M_insert<double>((double)this->m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  std::ostream::_M_insert<double>((double)this->m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  std::ostream::_M_insert<double>((double)this->m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  std::ostream::_M_insert<double>((double)this->m_w);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ]",2);
  return extraout_XMM0_Qa;
}

Assistant:

void log(tcu::MessageBuilder& message) const
		{
			message << "[ " << m_x << ", " << m_y << ", " << m_z << ", " << m_w << " ]";
		}